

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

Iterator aom_vector_iterator(Vector *vector,size_t index)

{
  Iterator IVar1;
  ulong in_RSI;
  Vector *in_RDI;
  Iterator iterator;
  void *local_10;
  size_t local_8;
  
  memset(&local_10,0,0x10);
  if (((in_RDI != (Vector *)0x0) && (in_RSI <= in_RDI->size)) && (in_RDI->element_size != 0)) {
    local_10 = _vector_offset(in_RDI,in_RSI);
    local_8 = in_RDI->element_size;
  }
  IVar1.element_size = local_8;
  IVar1.pointer = local_10;
  return IVar1;
}

Assistant:

Iterator aom_vector_iterator(Vector *vector, size_t index) {
  Iterator iterator = { NULL, 0 };

  assert(vector != NULL);
  assert(index <= vector->size);

  if (vector == NULL) return iterator;
  if (index > vector->size) return iterator;
  if (vector->element_size == 0) return iterator;

  iterator.pointer = _vector_offset(vector, index);
  iterator.element_size = vector->element_size;

  return iterator;
}